

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

void __thiscall flatbuffers::CodeWriter::operator+=(CodeWriter *this,string *text)

{
  undefined1 *puVar1;
  ulong uVar2;
  ulong uVar3;
  iterator iVar4;
  ostream *poVar5;
  string key;
  string local_50 [32];
  
  if ((this->ignore_ident_ == false) && (text->_M_string_length != 0)) {
    AppendIdent(this,&this->stream_);
  }
  puVar1 = &this->field_0x40;
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)text,0x27f183);
    if (uVar2 == 0xffffffffffffffff) break;
    uVar3 = std::__cxx11::string::find((char *)text,0x27e9fe);
    if ((uVar3 == 0xffffffffffffffff) || (uVar3 < uVar2)) break;
    std::ostream::write(puVar1,(long)(text->_M_dataplus)._M_p);
    std::__cxx11::string::substr((ulong)&key,(ulong)text);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this,&key);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->value_map_)._M_t._M_impl.super__Rb_tree_header)
    {
      __assert_fail("false && \"could not find key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/code_generators.cpp"
                    ,0x58,"void flatbuffers::CodeWriter::operator+=(std::string)");
    }
    std::operator<<((ostream *)puVar1,(string *)(iVar4._M_node + 2));
    std::__cxx11::string::substr((ulong)local_50,(ulong)text);
    std::__cxx11::string::operator=((string *)text,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&key);
  }
  if ((text->_M_string_length == 0) ||
     ((text->_M_dataplus)._M_p[text->_M_string_length - 1] != '\\')) {
    this->ignore_ident_ = false;
    poVar5 = std::operator<<((ostream *)puVar1,(string *)text);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    std::__cxx11::string::pop_back();
    this->ignore_ident_ = true;
    std::operator<<((ostream *)puVar1,(string *)text);
  }
  return;
}

Assistant:

void CodeWriter::operator+=(std::string text) {
  if (!ignore_ident_ && !text.empty()) AppendIdent(stream_);

  while (true) {
    auto begin = text.find("{{");
    if (begin == std::string::npos) { break; }

    auto end = text.find("}}");
    if (end == std::string::npos || end < begin) { break; }

    // Write all the text before the first {{ into the stream.
    stream_.write(text.c_str(), begin);

    // The key is between the {{ and }}.
    const std::string key = text.substr(begin + 2, end - begin - 2);

    // Find the value associated with the key.  If it exists, write the
    // value into the stream, otherwise write the key itself into the stream.
    auto iter = value_map_.find(key);
    if (iter != value_map_.end()) {
      const std::string &value = iter->second;
      stream_ << value;
    } else {
      FLATBUFFERS_ASSERT(false && "could not find key");
      stream_ << key;
    }

    // Update the text to everything after the }}.
    text = text.substr(end + 2);
  }
  if (!text.empty() && text.back() == '\\') {
    text.pop_back();
    ignore_ident_ = true;
    stream_ << text;
  } else {
    ignore_ident_ = false;
    stream_ << text << std::endl;
  }
}